

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

Lf_Cut_t * Lf_MemLoadCut(Lf_Mem_t *p,int iCur,int iObj,Lf_Cut_t *pCut,int fTruth,int fRecycle)

{
  Vec_Ptr_t *p_00;
  int i_00;
  int iVar1;
  uint uVar2;
  void *pvVar3;
  word local_58;
  uint local_48;
  int local_38;
  int Page;
  int Prev;
  int i;
  uchar *pPlace;
  int fRecycle_local;
  int fTruth_local;
  Lf_Cut_t *pCut_local;
  int iObj_local;
  int iCur_local;
  Lf_Mem_t *p_local;
  
  i_00 = iCur >> ((byte)p->LogPage & 0x1f);
  pPlace._0_4_ = fRecycle;
  pPlace._4_4_ = fTruth;
  _fRecycle_local = pCut;
  pCut_local._0_4_ = iObj;
  pCut_local._4_4_ = iCur;
  _iObj_local = p;
  iVar1 = Vec_PtrSize(&p->vPages);
  if (iVar1 <= i_00) {
    __assert_fail("Page < Vec_PtrSize(&p->vPages)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x227,"Lf_Cut_t *Lf_MemLoadCut(Lf_Mem_t *, int, int, Lf_Cut_t *, int, int)");
  }
  pvVar3 = Vec_PtrEntry(&_iObj_local->vPages,i_00);
  _Prev = (uchar *)((long)pvVar3 + (long)(int)(pCut_local._4_4_ & _iObj_local->MaskPage));
  uVar2 = Gia_AigerReadUnsigned((uchar **)&Prev);
  *(uint *)&_fRecycle_local->field_0x14 =
       *(uint *)&_fRecycle_local->field_0x14 & 0xffffff | uVar2 << 0x18;
  if (*(uint *)&_fRecycle_local->field_0x14 >> 0x18 < 0xd) {
    Page = *(uint *)&_fRecycle_local->field_0x14 >> 0x18;
    local_38 = iObj;
    while (Page = Page - 1, -1 < Page) {
      uVar2 = Gia_AigerReadUnsigned((uchar **)&Prev);
      *(uint *)((long)&_fRecycle_local[1].Sign + (long)Page * 4) = local_38 - uVar2;
      local_38 = *(int *)((long)&_fRecycle_local[1].Sign + (long)Page * 4);
    }
    if (pPlace._4_4_ == 0) {
      local_48 = 0xffffffff;
    }
    else {
      local_48 = Gia_AigerReadUnsigned((uchar **)&Prev);
    }
    _fRecycle_local->iFunc = local_48;
    if ((*(uint *)&_fRecycle_local->field_0x14 >> 0x18 < 2) && (3 < _fRecycle_local->iFunc)) {
      __assert_fail("pCut->nLeaves >= 2 || pCut->iFunc <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                    ,0x22e,"Lf_Cut_t *Lf_MemLoadCut(Lf_Mem_t *, int, int, Lf_Cut_t *, int, int)");
    }
    if (((int)pPlace != 0) && (i_00 != 0)) {
      pvVar3 = Vec_PtrEntry(&_iObj_local->vPages,i_00 + -1);
      if (pvVar3 != (void *)0x0) {
        p_00 = _iObj_local->vFree;
        pvVar3 = Vec_PtrEntry(&_iObj_local->vPages,i_00 + -1);
        Vec_PtrPush(p_00,pvVar3);
        Vec_PtrWriteEntry(&_iObj_local->vPages,i_00 + -1,(void *)0x0);
      }
    }
    if ((int)pPlace == 0) {
      local_58 = 0;
    }
    else {
      local_58 = Lf_CutGetSign(_fRecycle_local);
    }
    _fRecycle_local->Sign = local_58;
    *(uint *)&_fRecycle_local->field_0x14 = *(uint *)&_fRecycle_local->field_0x14 & 0xff7fffff;
    return _fRecycle_local;
  }
  __assert_fail("pCut->nLeaves <= LF_LEAF_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                ,0x22a,"Lf_Cut_t *Lf_MemLoadCut(Lf_Mem_t *, int, int, Lf_Cut_t *, int, int)");
}

Assistant:

static inline Lf_Cut_t * Lf_MemLoadCut( Lf_Mem_t * p, int iCur, int iObj, Lf_Cut_t * pCut, int fTruth, int fRecycle )
{
    unsigned char * pPlace;  
    int i, Prev = iObj, Page = iCur >> p->LogPage;
    assert( Page < Vec_PtrSize(&p->vPages) );
    pPlace = (unsigned char *)Vec_PtrEntry(&p->vPages, Page) + (iCur & p->MaskPage);
    pCut->nLeaves = Gia_AigerReadUnsigned(&pPlace);
    assert( pCut->nLeaves <= LF_LEAF_MAX );
    for ( i = pCut->nLeaves - 1; i >= 0; i-- )
        pCut->pLeaves[i] = Prev - Gia_AigerReadUnsigned(&pPlace), Prev = pCut->pLeaves[i];
    pCut->iFunc = fTruth ? Gia_AigerReadUnsigned(&pPlace) : -1;
    assert( pCut->nLeaves >= 2 || pCut->iFunc <= 3 );
    if ( fRecycle && Page && Vec_PtrEntry(&p->vPages, Page-1) )
    {
        Vec_PtrPush( p->vFree, Vec_PtrEntry(&p->vPages, Page-1) );
        Vec_PtrWriteEntry( &p->vPages, Page-1, NULL );
    }
    pCut->Sign = fRecycle ? Lf_CutGetSign(pCut) : 0;
    pCut->fMux7 = 0;
    return pCut;
}